

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_key(_glist *x,t_symbol *s,int ac,t_atom *av)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  t_symbol *ptVar4;
  void *pvVar5;
  uint cursornum;
  t_float tVar6;
  float local_74;
  undefined1 local_68 [8];
  t_atom at [2];
  char buf [5];
  int shift;
  int down;
  t_symbol *gotkeysym;
  int fflag;
  int keynum;
  t_atom *av_local;
  int ac_local;
  t_symbol *s_local;
  _glist *x_local;
  
  if (2 < ac) {
    *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x40) = 0;
    tVar6 = atom_getfloat(av);
    bVar1 = tVar6 != 0.0;
    tVar6 = atom_getfloat(av + 2);
    bVar2 = tVar6 != 0.0;
    if (av[1].a_type == A_SYMBOL) {
      _shift = av[1].a_w.w_symbol;
    }
    else if (av[1].a_type == A_FLOAT) {
      iVar3 = (int)av[1].a_w.w_float;
      if (iVar3 == 8) {
        _shift = gensym("BackSpace");
      }
      else if (iVar3 == 9) {
        _shift = gensym("Tab");
      }
      else if (iVar3 == 10) {
        _shift = gensym("Return");
      }
      else if (iVar3 == 0x1b) {
        _shift = gensym("Escape");
      }
      else if (iVar3 == 0x20) {
        _shift = gensym("Space");
      }
      else if (iVar3 == 0x7f) {
        _shift = gensym("Delete");
      }
      else {
        u8_wc_toutf8_nul((char *)((long)&at[1].a_w + 3),(uint32_t)(long)av[1].a_w.w_float);
        _shift = gensym((char *)((long)&at[1].a_w + 3));
      }
    }
    else {
      _shift = gensym("?");
    }
    if (av[1].a_type == A_FLOAT) {
      local_74 = av[1].a_w.w_float;
    }
    else {
      local_74 = 0.0;
    }
    gotkeysym._4_4_ = (uint)local_74;
    if ((gotkeysym._4_4_ == 0x7b) || (gotkeysym._4_4_ == 0x7d)) {
      post("keycode %d: dropped",(ulong)gotkeysym._4_4_);
    }
    else {
      if (gotkeysym._4_4_ == 0xd) {
        gotkeysym._4_4_ = 10;
      }
      if ((av[1].a_type == A_SYMBOL) &&
         (iVar3 = strcmp((av[1].a_w.w_symbol)->s_name,"Return"), iVar3 == 0)) {
        gotkeysym._4_4_ = 10;
      }
      if ((gotkeysym._4_4_ == 0x1e) || (gotkeysym._4_4_ == 0xf700)) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("Up");
      }
      else if ((gotkeysym._4_4_ == 0x1f) || (gotkeysym._4_4_ == 0xf701)) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("Down");
      }
      else if ((gotkeysym._4_4_ == 0x1c) || (gotkeysym._4_4_ == 0xf702)) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("Left");
      }
      else if ((gotkeysym._4_4_ == 0x1d) || (gotkeysym._4_4_ == 0xf703)) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("Right");
      }
      else if (gotkeysym._4_4_ == 0xf729) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("Home");
      }
      else if (gotkeysym._4_4_ == 0xf72b) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("End");
      }
      else if (gotkeysym._4_4_ == 0xf72c) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("Prior");
      }
      else if (gotkeysym._4_4_ == 0xf72d) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("Next");
      }
      else if (gotkeysym._4_4_ == 0xf704) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F1");
      }
      else if (gotkeysym._4_4_ == 0xf705) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F2");
      }
      else if (gotkeysym._4_4_ == 0xf706) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F3");
      }
      else if (gotkeysym._4_4_ == 0xf707) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F4");
      }
      else if (gotkeysym._4_4_ == 0xf708) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F5");
      }
      else if (gotkeysym._4_4_ == 0xf709) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F6");
      }
      else if (gotkeysym._4_4_ == 0xf70a) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F7");
      }
      else if (gotkeysym._4_4_ == 0xf70b) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F8");
      }
      else if (gotkeysym._4_4_ == 0xf70c) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F9");
      }
      else if (gotkeysym._4_4_ == 0xf70d) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F10");
      }
      else if (gotkeysym._4_4_ == 0xf70e) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F11");
      }
      else if (gotkeysym._4_4_ == 0xf70f) {
        gotkeysym._4_4_ = 0;
        _shift = gensym("F12");
      }
      ptVar4 = gensym("#key");
      if ((ptVar4->s_thing != (_class **)0x0) && (bVar1)) {
        ptVar4 = gensym("#key");
        pd_float(ptVar4->s_thing,(float)(int)gotkeysym._4_4_);
      }
      ptVar4 = gensym("#keyup");
      if ((ptVar4->s_thing != (_class **)0x0) && (!bVar1)) {
        ptVar4 = gensym("#keyup");
        pd_float(ptVar4->s_thing,(float)(int)gotkeysym._4_4_);
      }
      ptVar4 = gensym("#keyname");
      if (ptVar4->s_thing != (_class **)0x0) {
        local_68._4_4_ = (undefined4)((ulong)*(undefined8 *)av >> 0x20);
        local_68._0_4_ = A_FLOAT;
        at[0]._4_4_ = SUB84(av->a_w,4);
        at[0].a_type = (t_atomtype)(float)bVar1;
        at[0].a_w.w_float = 2.8026e-45;
        at[1]._0_8_ = _shift;
        ptVar4 = gensym("#keyname");
        pd_list(ptVar4->s_thing,(t_symbol *)0x0,2,(t_atom *)local_68);
      }
      if ((x != (_glist *)0x0) && (x->gl_editor != (t_editor *)0x0)) {
        if ((x != (_glist *)0x0) && (bVar1)) {
          if ((x->gl_editor->field_0x88 & 7) == 1) {
            x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xf8;
          }
          if (((x->gl_editor->e_grab == (t_gobj *)0x0) ||
              (x->gl_editor->e_keyfn == (t_glistkeyfn)0x0)) || (gotkeysym._4_4_ == 0)) {
            if ((x->gl_editor->e_textedfor == (_rtext *)0x0) ||
               (((((gotkeysym._4_4_ == 0 && (iVar3 = strcmp(_shift->s_name,"Home"), iVar3 != 0)) &&
                  ((iVar3 = strcmp(_shift->s_name,"End"), iVar3 != 0 &&
                   ((iVar3 = strcmp(_shift->s_name,"Up"), iVar3 != 0 &&
                    (iVar3 = strcmp(_shift->s_name,"Down"), iVar3 != 0)))))) &&
                 (iVar3 = strcmp(_shift->s_name,"Left"), iVar3 != 0)) &&
                (iVar3 = strcmp(_shift->s_name,"Right"), iVar3 != 0)))) {
              if ((gotkeysym._4_4_ == 8) || (gotkeysym._4_4_ == 0x7f)) {
                if (x->gl_editor->e_selection != (t_selection *)0x0) {
                  canvas_undo_add(x,UNDO_SEQUENCE_START,"clear",(void *)0x0);
                }
                if (((byte)x->gl_editor->field_0x88 >> 5 & 1) != 0) {
                  canvas_clearline(x);
                }
                if (x->gl_editor->e_selection != (t_selection *)0x0) {
                  pvVar5 = canvas_undo_set_cut(x,2);
                  canvas_undo_add(x,UNDO_CUT,"clear",pvVar5);
                  canvas_doclear(x);
                  canvas_undo_add(x,UNDO_SEQUENCE_END,"clear",(void *)0x0);
                }
              }
              else {
                iVar3 = strcmp(_shift->s_name,"Up");
                if (iVar3 == 0) {
                  iVar3 = -1;
                  if (bVar2) {
                    iVar3 = -10;
                  }
                  canvas_displaceselection(x,0,iVar3);
                }
                else {
                  iVar3 = strcmp(_shift->s_name,"Down");
                  if (iVar3 == 0) {
                    iVar3 = 1;
                    if (bVar2) {
                      iVar3 = 10;
                    }
                    canvas_displaceselection(x,0,iVar3);
                  }
                  else {
                    iVar3 = strcmp(_shift->s_name,"Left");
                    if (iVar3 == 0) {
                      iVar3 = -1;
                      if (bVar2) {
                        iVar3 = -10;
                      }
                      canvas_displaceselection(x,iVar3,0);
                    }
                    else {
                      iVar3 = strcmp(_shift->s_name,"Right");
                      if (iVar3 == 0) {
                        iVar3 = 1;
                        if (bVar2) {
                          iVar3 = 10;
                        }
                        canvas_displaceselection(x,iVar3,0);
                      }
                      else if ((((x->gl_editor->field_0x88 & 7) == 2) &&
                               (*(int *)((pd_maininstance.pd_gui)->i_editor + 0x90) == 5)) &&
                              (iVar3 = strncmp(_shift->s_name,"Shift",5), iVar3 == 0)) {
                        canvas_doconnect(x,x->gl_editor->e_xnew,x->gl_editor->e_ynew,1,1);
                        canvas_doclick(x,x->gl_editor->e_xwas,x->gl_editor->e_ywas,0,0,1);
                      }
                    }
                  }
                }
              }
            }
            else {
              if (((byte)x->gl_editor->field_0x88 >> 4 & 1) == 0) {
                pvVar5 = canvas_undo_set_cut(x,3);
                canvas_setundo(x,canvas_undo_cut,pvVar5,"typing");
              }
              rtext_key(x->gl_editor->e_textedfor,gotkeysym._4_4_,_shift);
              if (((byte)x->gl_editor->field_0x88 >> 4 & 1) != 0) {
                canvas_dirty(x,1.0);
              }
            }
          }
          else {
            (*x->gl_editor->e_keyfn)(x->gl_editor->e_grab,_shift,(float)(int)gotkeysym._4_4_);
          }
        }
        if (((x != (_glist *)0x0) && (gotkeysym._4_4_ == 0)) &&
           (((*(ushort *)&x->field_0xe8 >> 5 & 1) != 0 &&
            (iVar3 = strncmp(_shift->s_name,"Control",7), iVar3 == 0)))) {
          cursornum = 4;
          if (bVar1) {
            cursornum = 0;
          }
          canvas_setcursor(x,cursornum);
        }
      }
    }
  }
  return;
}

Assistant:

void canvas_key(t_canvas *x, t_symbol *s, int ac, t_atom *av)
{
    int keynum, fflag;
    t_symbol *gotkeysym;

    int down, shift;

    if (ac < 3)
        return;

    EDITOR->canvas_undo_already_set_move = 0;
    down = (atom_getfloat(av) != 0);  /* nonzero if it's a key down */
    shift = (atom_getfloat(av+2) != 0);  /* nonzero if shift-ed */
    if (av[1].a_type == A_SYMBOL)
        gotkeysym = av[1].a_w.w_symbol;
    else if (av[1].a_type == A_FLOAT)
    {
        char buf[UTF8_MAXBYTES1];
        switch((int)(av[1].a_w.w_float))
        {
        case 8:  gotkeysym = gensym("BackSpace"); break;
        case 9:  gotkeysym = gensym("Tab"); break;
        case 10: gotkeysym = gensym("Return"); break;
        case 27: gotkeysym = gensym("Escape"); break;
        case 32: gotkeysym = gensym("Space"); break;
        case 127:gotkeysym = gensym("Delete"); break;
        default:
                /*-- moo: assume keynum is a Unicode codepoint; encode as UTF-8 --*/
            u8_wc_toutf8_nul(buf, (UCS4)(av[1].a_w.w_float));
            gotkeysym = gensym(buf);
        }
    }
    else gotkeysym = gensym("?");
    fflag = (av[0].a_type == A_FLOAT ? av[0].a_w.w_float : 0);
    keynum = (av[1].a_type == A_FLOAT ? av[1].a_w.w_float : 0);
    if (keynum == '{' || keynum == '}')
    {
        post("keycode %d: dropped", (int)keynum);
        return;
    }
#if 0
    post("keynum %d, down %d", (int)keynum, down);
#endif
    if (keynum == '\r') keynum = '\n';
    if (av[1].a_type == A_SYMBOL &&
        !strcmp(av[1].a_w.w_symbol->s_name, "Return"))
            keynum = '\n';
        /* alias Apple key numbers to symbols.  This is done unconditionally,
           not just if we're on an Apple, just in case the GUI is remote. */
    if (keynum == 30 || keynum == 63232)
        keynum = 0, gotkeysym = gensym("Up");
    else if (keynum == 31 || keynum == 63233)
        keynum = 0, gotkeysym = gensym("Down");
    else if (keynum == 28 || keynum == 63234)
        keynum = 0, gotkeysym = gensym("Left");
    else if (keynum == 29 || keynum == 63235)
        keynum = 0, gotkeysym = gensym("Right");
    else if (keynum == 63273)
        keynum = 0, gotkeysym = gensym("Home");
    else if (keynum == 63275)
        keynum = 0, gotkeysym = gensym("End");
    else if (keynum == 63276)
        keynum = 0, gotkeysym = gensym("Prior");
    else if (keynum == 63277)
        keynum = 0, gotkeysym = gensym("Next");
    else if (keynum == 63236)
        keynum = 0, gotkeysym = gensym("F1");
    else if (keynum == 63237)
        keynum = 0, gotkeysym = gensym("F2");
    else if (keynum == 63238)
        keynum = 0, gotkeysym = gensym("F3");
    else if (keynum == 63239)
        keynum = 0, gotkeysym = gensym("F4");
    else if (keynum == 63240)
        keynum = 0, gotkeysym = gensym("F5");
    else if (keynum == 63241)
        keynum = 0, gotkeysym = gensym("F6");
    else if (keynum == 63242)
        keynum = 0, gotkeysym = gensym("F7");
    else if (keynum == 63243)
        keynum = 0, gotkeysym = gensym("F8");
    else if (keynum == 63244)
        keynum = 0, gotkeysym = gensym("F9");
    else if (keynum == 63245)
        keynum = 0, gotkeysym = gensym("F10");
    else if (keynum == 63246)
        keynum = 0, gotkeysym = gensym("F11");
    else if (keynum == 63247)
        keynum = 0, gotkeysym = gensym("F12");
    if (gensym("#key")->s_thing && down)
        pd_float(gensym("#key")->s_thing, (t_float)keynum);
    if (gensym("#keyup")->s_thing && !down)
        pd_float(gensym("#keyup")->s_thing, (t_float)keynum);
    if (gensym("#keyname")->s_thing)
    {
        t_atom at[2];
        at[0] = av[0];
        SETFLOAT(at, down);
        SETSYMBOL(at+1, gotkeysym);
        pd_list(gensym("#keyname")->s_thing, 0, 2, at);
    }
    if (!x || !x->gl_editor)  /* if that 'invis'ed the window,  stop. */
        return;
    if (x && down)
    {
            /* cancel any dragging action */
        if (x->gl_editor->e_onmotion == MA_MOVE)
            x->gl_editor->e_onmotion = MA_NONE;
            /* if an object has "grabbed" keys just send them on */
        if (x->gl_editor->e_grab
            && x->gl_editor->e_keyfn && keynum)
                (* x->gl_editor->e_keyfn)
                    (x->gl_editor->e_grab, gotkeysym, (t_float)keynum);
            /* if a text editor is open send the key on, as long as
               it is either "real" (has a key number) or else is an arrow key. */
        else if (x->gl_editor->e_textedfor && (keynum
            || !strcmp(gotkeysym->s_name, "Home")
            || !strcmp(gotkeysym->s_name, "End")
            || !strcmp(gotkeysym->s_name, "Up")
            || !strcmp(gotkeysym->s_name, "Down")
            || !strcmp(gotkeysym->s_name, "Left")
            || !strcmp(gotkeysym->s_name, "Right")))
        {
                /* send the key to the box's editor */
            if (!x->gl_editor->e_textdirty)
            {
                canvas_setundo(x, canvas_undo_cut,
                    canvas_undo_set_cut(x, UCUT_TEXT), "typing");
            }
            rtext_key(x->gl_editor->e_textedfor,
                (int)keynum, gotkeysym);
            if (x->gl_editor->e_textdirty)
                canvas_dirty(x, 1);
        }
            /* check for backspace or clear */
        else if (keynum == 8 || keynum == 127)
        {
            if (x->gl_editor->e_selection)
                canvas_undo_add(x, UNDO_SEQUENCE_START, "clear", 0);
            if (x->gl_editor->e_selectedline)
                canvas_clearline(x);
            if (x->gl_editor->e_selection)
            {
                canvas_undo_add(x, UNDO_CUT, "clear",
                    canvas_undo_set_cut(x, UCUT_CLEAR));
                canvas_doclear(x);
                canvas_undo_add(x, UNDO_SEQUENCE_END, "clear", 0);
            }
        }
            /* check for arrow keys */
        else if (!strcmp(gotkeysym->s_name, "Up"))
            canvas_displaceselection(x, 0, shift ? -10 : -1);
        else if (!strcmp(gotkeysym->s_name, "Down"))
            canvas_displaceselection(x, 0, shift ? 10 : 1);
        else if (!strcmp(gotkeysym->s_name, "Left"))
            canvas_displaceselection(x, shift ? -10 : -1, 0);
        else if (!strcmp(gotkeysym->s_name, "Right"))
            canvas_displaceselection(x, shift ? 10 : 1, 0);
        else if ((MA_CONNECT == x->gl_editor->e_onmotion)
            && (CURSOR_EDITMODE_CONNECT == EDITOR->canvas_cursorwas)
                 && !strncmp(gotkeysym->s_name, "Shift", 5))
        {
                /* <Shift> while in connect-mode: create connection... */
            canvas_doconnect(x, x->gl_editor->e_xnew, x->gl_editor->e_ynew, 1, 1);
                /* ... and continue in connect-mode */
            canvas_doclick(x, x->gl_editor->e_xwas, x->gl_editor->e_ywas, 0, 0, 1);

        }
    }
        /* if control key goes up or down, and if we're in edit mode, change
           cursor to indicate how the click action changes */
    if (x && keynum == 0 && x->gl_edit &&
        !strncmp(gotkeysym->s_name, "Control", 7))
            canvas_setcursor(x, down ?
                CURSOR_RUNMODE_NOTHING :CURSOR_EDITMODE_NOTHING);
}